

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
FBX::Decoder::decompress<double>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,Decoder *this,
          Span<char> *source)

{
  int iVar1;
  uint uVar2;
  runtime_error *this_00;
  size_t sVar3;
  size_type sVar4;
  size_type sVar5;
  double *pdVar6;
  char *__src;
  size_t size;
  size_t have;
  size_t toConsume;
  size_t consumed;
  char *pcStack_c8;
  int ret;
  z_stream infstream;
  allocator_type local_41;
  undefined1 local_40 [8];
  vector<char,_std::allocator<char>_> out;
  Span<char> *source_local;
  Decoder *this_local;
  vector<double,_std::allocator<double>_> *buffer;
  
  out.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 0;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_40,1000000,&local_41);
  std::allocator<char>::~allocator(&local_41);
  infstream.state = (internal_state *)0x0;
  infstream.zalloc = (alloc_func)0x0;
  infstream.zfree = (free_func)0x0;
  infstream.next_in._0_4_ = 0;
  pcStack_c8 = (char *)0x0;
  iVar1 = inflateInit_(&stack0xffffffffffffff38,"1.2.11",0x70);
  if (iVar1 != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Failed to initialize inflate");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  toConsume = 0;
  do {
    sVar3 = Span<char>::size(source);
    if (sVar3 < toConsume + 1000000) {
      sVar3 = Span<char>::size(source);
      have = sVar3 - toConsume;
    }
    else {
      have = 1000000;
    }
    infstream.next_in._0_4_ = (undefined4)have;
    pcStack_c8 = source->begin + toConsume;
    toConsume = have + toConsume;
    do {
      infstream.next_out._0_4_ = 1000000;
      infstream.total_in =
           (uLong)std::vector<char,_std::allocator<char>_>::data
                            ((vector<char,_std::allocator<char>_> *)local_40);
      iVar1 = inflate(&stack0xffffffffffffff38,0);
      uVar2 = 1000000 - (int)infstream.next_out;
      sVar4 = std::vector<double,_std::allocator<double>_>::size(__return_storage_ptr__);
      if (uVar2 < have) {
        __assert_fail("toConsume <= have",
                      "/workspace/llm4binary/github/license_c_cmakelists/WinteryFox[P]FBXImport/importer/src/Decoder.cpp"
                      ,99,
                      "std::vector<T> FBX::Decoder::decompress(const Span<char> &) const [T = double]"
                     );
      }
      sVar5 = std::vector<double,_std::allocator<double>_>::size(__return_storage_ptr__);
      std::vector<double,_std::allocator<double>_>::resize
                (__return_storage_ptr__,sVar5 + (uVar2 >> 3));
      pdVar6 = std::vector<double,_std::allocator<double>_>::data(__return_storage_ptr__);
      __src = std::vector<char,_std::allocator<char>_>::data
                        ((vector<char,_std::allocator<char>_> *)local_40);
      memcpy(pdVar6 + sVar4 * 8,__src,(ulong)uVar2);
    } while ((int)infstream.next_out == 0);
  } while (iVar1 != 1);
  inflateEnd(&stack0xffffffffffffff38);
  out.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 1;
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_40)
  ;
  if ((out.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ & 1) == 0) {
    std::vector<double,_std::allocator<double>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> Decoder::decompress(const Span<char> &source) const {
        std::vector<T> buffer;
        std::vector<char> out(FBX_CHUNK);

        z_stream infstream;
        infstream.zalloc = Z_NULL;
        infstream.zfree = Z_NULL;
        infstream.opaque = Z_NULL;
        infstream.avail_in = 0;
        infstream.next_in = Z_NULL;

        if (inflateInit(&infstream) != Z_OK) {
            throw std::runtime_error("Failed to initialize inflate");
        }

        int ret;
        size_t consumed = 0;
        do {
            size_t toConsume;
            if (consumed + FBX_CHUNK > source.size())
                toConsume = source.size() - consumed;
            else
                toConsume = FBX_CHUNK;

            infstream.avail_in = toConsume;
            infstream.next_in = (Bytef *) source.begin + consumed;
            consumed += toConsume;

            do {
                infstream.avail_out = FBX_CHUNK;
                infstream.next_out = (Bytef *) out.data();

                ret = inflate(&infstream, Z_NO_FLUSH);

                size_t have = FBX_CHUNK - infstream.avail_out;
                size_t size = buffer.size() * sizeof(T);

                assert(toConsume <= have); // TODO: Fix buffer overflow for large chunks to inflate

                buffer.resize(buffer.size() + have / sizeof(T));
                std::memcpy(buffer.data() + size, out.data(), have);
            } while (infstream.avail_out == 0);
        } while (ret != Z_STREAM_END);
        inflateEnd(&infstream);
        return buffer;
    }